

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  ZSTD_seqSymbol *pZVar1;
  byte bVar2;
  byte bVar3;
  BYTE *pBVar4;
  ulong uVar5;
  seq_t sequence;
  seq_t sequence_00;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  BYTE *op_2;
  size_t sVar10;
  size_t sVar11;
  ZSTD_seqSymbol *pZVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  BYTE *pBVar16;
  byte *pbVar17;
  byte *pbVar18;
  size_t sVar19;
  byte *oend_00;
  void *src_00;
  ZSTD_seqSymbol *pZVar20;
  byte *pbVar21;
  ulong uVar22;
  size_t seqSize;
  ZSTD_seqSymbol *pZVar23;
  ulong uVar24;
  byte *pbVar25;
  ulong uVar26;
  BYTE *oend;
  byte *pbVar27;
  ulong *puVar28;
  size_t __n;
  ZSTD_seqSymbol ZVar29;
  void *pvVar30;
  BYTE *litPtr;
  int nbSeq;
  seq_t sequences [4];
  ZSTD_longOffset_e in_stack_fffffffffffffdd8;
  BYTE *local_1f8;
  ZSTD_seqSymbol *local_1d0;
  BYTE *local_1c8;
  int local_1c0;
  int local_1bc;
  byte *local_1b8;
  byte *local_1b0;
  ZSTD_seqSymbol *local_1a8;
  ZSTD_seqSymbol *local_1a0;
  ZSTD_seqSymbol *local_198;
  int local_18c;
  void *local_188;
  ZSTD_seqSymbol *local_180;
  BIT_DStream_t local_178;
  ZSTD_fseState local_150;
  ZSTD_fseState local_140;
  ZSTD_fseState local_130;
  ZSTD_seqSymbol *local_120 [3];
  byte *local_108 [4];
  BYTE *local_e8;
  byte *local_e0;
  BYTE *local_d8;
  ZSTD_seqSymbol *local_d0;
  byte *local_c8;
  byte *local_c0;
  ulong local_b8;
  size_t local_b0;
  ulong local_a8 [15];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar10 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  src_00 = (void *)((long)src + sVar10);
  sVar10 = srcSize - sVar10;
  iVar8 = dctx->ddictIsCold;
  sVar11 = ZSTD_decodeSeqHeaders(dctx,&local_1bc,src_00,sVar10);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  pZVar1 = (ZSTD_seqSymbol *)((long)src_00 + sVar11);
  seqSize = sVar10 - sVar11;
  if (iVar8 == 0) {
    if (((frame != 0) && ((dctx->fParams).windowSize < 0x1000001)) || (local_1bc < 5)) {
      dctx->ddictIsCold = 0;
LAB_0014ea33:
      sVar10 = ZSTD_decompressSequences
                         (dctx,dst,dstCapacity,pZVar1,seqSize,local_1bc,in_stack_fffffffffffffdd8);
      return sVar10;
    }
    iVar8 = 0;
    uVar9 = 1;
    do {
      iVar8 = (iVar8 + 1) - (uint)(dctx->OFTptr[(ulong)(uVar9 - 1) + 1].nbAdditionalBits < 0x17);
      bVar13 = (byte)dctx->OFTptr->baseValue;
      uVar7 = uVar9 >> (bVar13 & 0x1f);
      uVar9 = uVar9 + 1;
    } while (uVar7 == 0);
    dctx->ddictIsCold = 0;
    if ((uint)(iVar8 << (8 - bVar13 & 0x1f)) < 7) goto LAB_0014ea33;
  }
  else {
    dctx->ddictIsCold = 0;
  }
  if (dctx->bmi2 != 0) {
    sVar10 = ZSTD_decompressSequencesLong_bmi2
                       (dctx,dst,dstCapacity,pZVar1,seqSize,local_1bc,in_stack_fffffffffffffdd8);
    return sVar10;
  }
  oend_00 = (byte *)(dstCapacity + (long)dst);
  local_1c8 = dctx->litPtr;
  pBVar16 = local_1c8 + dctx->litSize;
  local_1f8 = (BYTE *)dst;
  if (local_1bc != 0) {
    local_108[0] = (byte *)dctx->prefixStart;
    pBVar4 = (BYTE *)dctx->virtualStart;
    local_108[1] = (byte *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar14 = -0xc;
    do {
      *(ulong *)((long)local_108 + lVar14 * 2) = (ulong)*(uint *)((long)dctx->workspace + lVar14);
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0);
    iVar8 = 4;
    if (local_1bc < 4) {
      iVar8 = local_1bc;
    }
    local_108[2] = (byte *)((long)dst - (long)local_108[0]);
    pvVar30 = dst;
    local_e8 = pBVar16;
    if (sVar10 == sVar11) {
      local_178.ptr = (char *)0x0;
      local_178.start = (char *)0x0;
      local_178.bitContainer._0_2_ = 0;
      local_178.bitContainer._2_1_ = '\0';
      local_178.bitContainer._3_1_ = '\0';
      local_178.bitContainer._4_4_ = 0;
      local_178._8_8_ = 0;
      local_178.limitPtr = (char *)0x0;
    }
    else {
      local_178.limitPtr = (char *)(pZVar1 + 1);
      local_178.start = (char *)pZVar1;
      if (seqSize < 8) {
        local_178.bitContainer._1_7_ = 0;
        local_178.bitContainer._0_1_ = (byte)pZVar1->nextState;
        switch(seqSize) {
        case 7:
          local_178.bitContainer =
               (ulong)*(byte *)((long)&pZVar1->baseValue + 2) << 0x30 | local_178.bitContainer;
        case 6:
          local_178.bitContainer =
               local_178.bitContainer + ((ulong)*(byte *)((long)&pZVar1->baseValue + 1) << 0x28);
        case 5:
          local_178.bitContainer = local_178.bitContainer + ((ulong)(byte)pZVar1->baseValue << 0x20)
          ;
        case 4:
          local_178.bitContainer = local_178.bitContainer + (ulong)pZVar1->nbBits * 0x1000000;
        case 3:
          local_178.bitContainer =
               local_178.bitContainer + (ulong)pZVar1->nbAdditionalBits * 0x10000;
        case 2:
          local_178.bitContainer =
               local_178.bitContainer + (ulong)*(byte *)((long)&pZVar1->nextState + 1) * 0x100;
        }
        bVar13 = *(byte *)((long)src_00 + (sVar10 - 1));
        uVar9 = 0x1f;
        if (bVar13 != 0) {
          for (; bVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        local_178.bitsConsumed = ~uVar9 + 9;
        if (bVar13 == 0) {
          local_178.bitsConsumed = 0;
        }
        local_18c = iVar8;
        local_178.ptr = (char *)pZVar1;
        if (bVar13 != 0) {
          local_178.bitsConsumed = local_178.bitsConsumed + (int)seqSize * -8 + 0x40;
LAB_0014eb9d:
          local_1c0 = local_1bc;
          local_1b8 = local_108[0];
          local_18c = iVar8;
          local_108[3] = local_108[1];
          local_d8 = pBVar4;
          ZSTD_initFseState(&local_150,&local_178,dctx->LLTptr);
          ZSTD_initFseState(&local_140,&local_178,dctx->OFTptr);
          ZSTD_initFseState(&local_130,&local_178,dctx->MLTptr);
          pZVar1 = local_130.table;
          local_d0 = (ZSTD_seqSymbol *)local_178.limitPtr;
          local_198 = local_140.table;
          local_c0 = local_108[1];
          local_c8 = local_108[0];
          local_180 = (ZSTD_seqSymbol *)local_178.ptr;
          local_1a0 = local_120[1];
          local_e0 = (byte *)(long)local_18c;
          puVar28 = local_a8 + 1;
          uVar26 = 0;
          local_1a8 = (ZSTD_seqSymbol *)local_178.start;
          pZVar12 = local_120[0];
          ZVar29 = (ZSTD_seqSymbol)local_178.bitContainer;
          uVar9 = local_178.bitsConsumed;
          do {
            pZVar20 = local_180;
            uVar7 = uVar9;
            if (uVar9 < 0x41) {
              if (local_180 < local_178.limitPtr) {
                if (local_180 == (ZSTD_seqSymbol *)local_178.start) goto LAB_0014ed4d;
                uVar22 = (ulong)(uint)((int)local_180 - (int)local_178.start);
                if (local_178.start <= (ZSTD_seqSymbol *)((long)local_180 - (ulong)(uVar9 >> 3))) {
                  uVar22 = (ulong)(uVar9 >> 3);
                }
                uVar7 = uVar9 + (int)uVar22 * -8;
              }
              else {
                uVar22 = (ulong)(uVar9 >> 3);
                uVar7 = uVar9 & 7;
              }
              local_178.ptr = (char *)((long)local_180 - uVar22);
              local_178.bitsConsumed = uVar7;
              ZVar29 = *(ZSTD_seqSymbol *)local_178.ptr;
              pZVar20 = (ZSTD_seqSymbol *)local_178.ptr;
              local_178.bitContainer = (size_t)ZVar29;
            }
LAB_0014ed4d:
            if ((0x40 < uVar9) || ((long)local_e0 <= (long)uVar26)) goto LAB_0014f00b;
            bVar13 = local_150.table[local_150.state].nbAdditionalBits;
            bVar2 = local_130.table[local_130.state].nbAdditionalBits;
            bVar3 = local_140.table[local_140.state].nbAdditionalBits;
            local_1b0 = (byte *)(ulong)local_130.table[local_130.state].baseValue;
            if (bVar3 == 0) {
              pZVar23 = (ZSTD_seqSymbol *)0x0;
            }
            else {
              pZVar23 = (ZSTD_seqSymbol *)
                        (((ulong)((long)ZVar29 << ((byte)uVar7 & 0x3f)) >> (-bVar3 & 0x3f)) +
                        (ulong)local_140.table[local_140.state].baseValue);
              uVar7 = uVar7 + bVar3;
              local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
            }
            if (bVar3 < 2) {
              lVar14 = (long)&pZVar23->nextState +
                       (ulong)((ulong)local_150.table[local_150.state].baseValue == 0);
              pZVar23 = pZVar12;
              if (lVar14 != 0) {
                if (lVar14 == 3) {
                  pZVar23 = (ZSTD_seqSymbol *)((long)&pZVar12[-1].baseValue + 3);
                }
                else {
                  pZVar23 = local_120[lVar14];
                }
                pZVar23 = (ZSTD_seqSymbol *)
                          ((long)&pZVar23->nextState + (ulong)(pZVar23 == (ZSTD_seqSymbol *)0x0));
                if (lVar14 != 1) goto LAB_0014ee07;
                goto LAB_0014ee17;
              }
            }
            else {
LAB_0014ee07:
              local_120[2] = local_1a0;
LAB_0014ee17:
              local_120[1] = pZVar12;
              local_120[0] = pZVar23;
              local_1a0 = pZVar12;
            }
            pZVar12 = pZVar23;
            if (bVar2 == 0) {
              uVar22 = 0;
            }
            else {
              uVar22 = (ulong)((long)ZVar29 << ((byte)uVar7 & 0x3f)) >> (-bVar2 & 0x3f);
              uVar7 = uVar7 + bVar2;
            }
            if ((0x1e < (uint)bVar2 + (uint)bVar13 + (uint)bVar3) && (uVar7 < 0x41)) {
              if (pZVar20 < local_178.limitPtr) {
                if (pZVar20 == (ZSTD_seqSymbol *)local_178.start) goto LAB_0014eecb;
                uVar9 = (int)pZVar20 - (int)local_178.start;
                if (local_178.start <= (ZSTD_seqSymbol *)((long)pZVar20 - (ulong)(uVar7 >> 3))) {
                  uVar9 = uVar7 >> 3;
                }
                uVar7 = uVar7 + uVar9 * -8;
              }
              else {
                uVar9 = uVar7 >> 3;
                uVar7 = uVar7 & 7;
              }
              pZVar20 = (ZSTD_seqSymbol *)((long)pZVar20 - (ulong)uVar9);
              ZVar29 = *pZVar20;
              local_178.bitContainer = (size_t)ZVar29;
              local_178.ptr = (char *)pZVar20;
            }
LAB_0014eecb:
            if (bVar13 == 0) {
              uVar24 = 0;
            }
            else {
              uVar24 = (ulong)((long)ZVar29 << ((byte)uVar7 & 0x3f)) >> (-bVar13 & 0x3f);
              uVar7 = uVar7 + bVar13;
            }
            uVar24 = uVar24 + local_150.table[local_150.state].baseValue;
            pZVar23 = (ZSTD_seqSymbol *)(local_108[2] + uVar24);
            pbVar25 = local_c8;
            if (pZVar23 < pZVar12) {
              pbVar25 = local_108[1];
            }
            local_108[2] = local_1b0 + uVar22 + (long)&pZVar23->nextState;
            iVar8 = uVar7 + local_150.table[local_150.state].nbBits;
            local_150.state =
                 (ulong)((uint)((ulong)ZVar29 >> (-(char)iVar8 & 0x3fU)) &
                        BIT_mask[local_150.table[local_150.state].nbBits]) +
                 (ulong)local_150.table[local_150.state].nextState;
            iVar8 = iVar8 + (uint)local_130.table[local_130.state].nbBits;
            local_130.state =
                 (ulong)((uint)((ulong)ZVar29 >> (-(char)iVar8 & 0x3fU)) &
                        BIT_mask[local_130.table[local_130.state].nbBits]) +
                 (ulong)local_130.table[local_130.state].nextState;
            uVar9 = iVar8 + (uint)local_140.table[local_140.state].nbBits;
            local_140.state =
                 (ulong)((uint)((ulong)ZVar29 >> (-(char)uVar9 & 0x3fU)) &
                        BIT_mask[local_140.table[local_140.state].nbBits]) +
                 (ulong)local_140.table[local_140.state].nextState;
            puVar28[-3] = uVar24;
            local_178._8_8_ = CONCAT44(local_178._12_4_,uVar9);
            puVar28[-2] = (ulong)(local_1b0 + uVar22);
            puVar28[-1] = (ulong)pZVar12;
            *puVar28 = (long)(pbVar25 + (long)pZVar23) - (long)pZVar12;
            uVar26 = uVar26 + 1;
            puVar28 = puVar28 + 4;
            local_180 = pZVar20;
          } while( true );
        }
      }
      else {
        local_178.ptr = (char *)((long)src_00 + (sVar10 - 8));
        local_178.bitContainer = *(size_t *)local_178.ptr;
        bVar13 = *(byte *)((long)src_00 + (sVar10 - 1));
        uVar9 = 0x1f;
        if (bVar13 != 0) {
          for (; bVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        local_178.bitsConsumed = ~uVar9 + 9;
        if (bVar13 == 0) {
          local_178.bitsConsumed = 0;
        }
        bVar6 = false;
        local_1d0 = (ZSTD_seqSymbol *)0xffffffffffffffec;
        if (seqSize < 0xffffffffffffff89) {
          local_18c = iVar8;
          if (bVar13 != 0) goto LAB_0014eb9d;
          goto LAB_0014fa8f;
        }
      }
    }
    local_1d0 = (ZSTD_seqSymbol *)0xffffffffffffffec;
    bVar6 = false;
    goto LAB_0014fa8f;
  }
  goto LAB_0014faa5;
LAB_0014f00b:
  local_1d0 = (ZSTD_seqSymbol *)0xffffffffffffffec;
  local_188 = dst;
  if ((long)local_e0 <= (long)uVar26) {
    local_1b0 = oend_00 + -8;
    local_e0 = oend_00 + -0xd;
    do {
      pZVar12 = local_120[1];
      uVar9 = local_178.bitsConsumed;
      if (local_178.bitsConsumed < 0x41) {
        if (local_178.ptr < local_178.limitPtr) {
          if (local_178.ptr == local_178.start) goto LAB_0014f0dd;
          uVar7 = (int)local_178.ptr - (int)local_178.start;
          if (local_178.start <=
              (ZSTD_seqSymbol *)((long)local_178.ptr - (ulong)(local_178.bitsConsumed >> 3))) {
            uVar7 = local_178.bitsConsumed >> 3;
          }
          uVar15 = local_178.bitsConsumed + uVar7 * -8;
        }
        else {
          uVar7 = local_178.bitsConsumed >> 3;
          uVar15 = local_178.bitsConsumed & 7;
        }
        local_178.ptr = (char *)((long)local_178.ptr - (ulong)uVar7);
        local_178.bitsConsumed = uVar15;
        local_178.bitContainer = *(size_t *)local_178.ptr;
      }
LAB_0014f0dd:
      uVar7 = (uint)uVar26;
      local_1f8 = (BYTE *)dst;
      if ((0x40 < uVar9) || (local_1c0 <= (int)uVar7)) {
        if ((int)uVar7 < local_1c0) {
          bVar6 = false;
          pvVar30 = local_188;
          goto LAB_0014fa8f;
        }
        uVar7 = uVar7 - local_18c;
        if ((int)uVar7 < local_1c0) goto LAB_0014f761;
        goto LAB_0014fa55;
      }
      bVar13 = local_150.table[local_150.state].nbAdditionalBits;
      bVar2 = local_130.table[local_130.state].nbAdditionalBits;
      bVar3 = local_140.table[local_140.state].nbAdditionalBits;
      if (bVar3 == 0) {
        pZVar20 = (ZSTD_seqSymbol *)0x0;
      }
      else {
        pZVar20 = (ZSTD_seqSymbol *)
                  (((local_178.bitContainer << ((byte)local_178.bitsConsumed & 0x3f)) >>
                   (-bVar3 & 0x3f)) + (ulong)local_140.table[local_140.state].baseValue);
        local_178.bitsConsumed = local_178.bitsConsumed + bVar3;
      }
      if (bVar3 < 2) {
        lVar14 = (long)&pZVar20->nextState +
                 (ulong)((ulong)local_150.table[local_150.state].baseValue == 0);
        if (lVar14 != 0) {
          if (lVar14 == 3) {
            pZVar12 = (ZSTD_seqSymbol *)((long)&local_120[0][-1].baseValue + 3);
          }
          else {
            pZVar12 = local_120[lVar14];
          }
          if (lVar14 != 1) {
            local_120[2] = local_120[1];
          }
          local_120[1] = local_120[0];
          local_120[0] = (ZSTD_seqSymbol *)
                         ((long)&pZVar12->nextState + (ulong)(pZVar12 == (ZSTD_seqSymbol *)0x0));
        }
      }
      else {
        local_120[1] = local_120[0];
        local_120[2] = pZVar12;
        local_120[0] = pZVar20;
      }
      if (bVar2 == 0) {
        uVar26 = 0;
      }
      else {
        uVar26 = (local_178.bitContainer << ((byte)local_178.bitsConsumed & 0x3f)) >>
                 (-bVar2 & 0x3f);
        local_178.bitsConsumed = local_178.bitsConsumed + bVar2;
      }
      if ((0x1e < (uint)bVar2 + (uint)bVar13 + (uint)bVar3) && (local_178.bitsConsumed < 0x41)) {
        if (local_178.ptr < local_178.limitPtr) {
          if (local_178.ptr == local_178.start) goto LAB_0014f2d9;
          uVar22 = (ulong)(uint)((int)local_178.ptr - (int)local_178.start);
          if (local_178.start <=
              (ZSTD_seqSymbol *)((long)local_178.ptr - (ulong)(local_178.bitsConsumed >> 3))) {
            uVar22 = (ulong)(local_178.bitsConsumed >> 3);
          }
          uVar9 = local_178.bitsConsumed + (int)uVar22 * -8;
        }
        else {
          uVar22 = (ulong)(local_178.bitsConsumed >> 3);
          uVar9 = local_178.bitsConsumed & 7;
        }
        local_178.ptr = (char *)((long)local_178.ptr - uVar22);
        local_178.bitsConsumed = uVar9;
        local_178.bitContainer = *(size_t *)local_178.ptr;
      }
LAB_0014f2d9:
      if (bVar13 == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = (local_178.bitContainer << ((byte)local_178.bitsConsumed & 0x3f)) >>
                 (-bVar13 & 0x3f);
        local_178.bitsConsumed = local_178.bitsConsumed + bVar13;
      }
      lVar14 = uVar26 + local_130.table[local_130.state].baseValue;
      uVar22 = uVar22 + local_150.table[local_150.state].baseValue;
      pZVar12 = (ZSTD_seqSymbol *)(local_108[2] + uVar22);
      local_198 = (ZSTD_seqSymbol *)
                  ((long)&pZVar12->nextState + (long)local_108[pZVar12 < local_120[0]]);
      local_108[2] = (byte *)((long)&pZVar12->nextState + lVar14);
      iVar8 = local_178.bitsConsumed + local_150.table[local_150.state].nbBits;
      local_150.state =
           (ulong)((uint)(local_178.bitContainer >> (-(char)iVar8 & 0x3fU)) &
                  BIT_mask[local_150.table[local_150.state].nbBits]) +
           (ulong)local_150.table[local_150.state].nextState;
      iVar8 = iVar8 + (uint)local_130.table[local_130.state].nbBits;
      local_130.state =
           (ulong)((uint)(local_178.bitContainer >> (-(char)iVar8 & 0x3fU)) &
                  BIT_mask[local_130.table[local_130.state].nbBits]) +
           (ulong)local_130.table[local_130.state].nextState;
      iVar8 = iVar8 + (uint)local_140.table[local_140.state].nbBits;
      local_178._8_8_ = CONCAT44(local_178._12_4_,iVar8);
      local_140.state =
           (ulong)((uint)(local_178.bitContainer >> (-(char)iVar8 & 0x3fU)) &
                  BIT_mask[local_140.table[local_140.state].nbBits]) +
           (ulong)local_140.table[local_140.state].nextState;
      uVar24 = (ulong)((uVar7 & 3) << 5);
      puVar28 = (ulong *)((long)&local_b8 + uVar24);
      uVar26 = *puVar28;
      pZVar20 = *(ZSTD_seqSymbol **)((long)&local_b0 + uVar24);
      pZVar12 = (ZSTD_seqSymbol *)((long)&pZVar20->nextState + uVar26);
      pbVar25 = (byte *)((long)dst + (long)pZVar12);
      pZVar23 = (ZSTD_seqSymbol *)0xffffffffffffffba;
      local_180 = local_120[0];
      if (pbVar25 <= oend_00) {
        pBVar16 = local_1c8 + uVar26;
        pZVar23 = (ZSTD_seqSymbol *)0xffffffffffffffec;
        if (pBVar16 <= local_e8) {
          pbVar27 = (byte *)((long)dst + uVar26);
          if (local_1b0 < pbVar27) {
            sequence.matchLength = *(undefined8 *)((long)&local_b0 + uVar24);
            sequence.litLength = *puVar28;
            sequence.offset = *(undefined8 *)((long)local_a8 + uVar24);
            sequence.match = *(BYTE **)((long)local_a8 + uVar24 + 8);
            pZVar23 = (ZSTD_seqSymbol *)
                      ZSTD_execSequenceLast7
                                ((BYTE *)dst,oend_00,sequence,&local_1c8,local_e8,local_1b8,local_d8
                                 ,local_108[3]);
          }
          else {
            uVar5 = *(ulong *)((long)local_a8 + uVar24);
            pbVar21 = *(byte **)((long)local_a8 + uVar24 + 8);
            *(undefined8 *)dst = *(undefined8 *)local_1c8;
            if (8 < uVar26) {
              pbVar17 = (byte *)((long)dst + 8);
              do {
                local_1c8 = local_1c8 + 8;
                *(undefined8 *)pbVar17 = *(undefined8 *)local_1c8;
                pbVar17 = pbVar17 + 8;
              } while (pbVar17 < pbVar27);
            }
            local_1c8 = pBVar16;
            local_1a8 = pZVar12;
            if ((ulong)((long)pbVar27 - (long)local_1b8) < uVar5) {
              local_1a0 = pZVar20;
              if (uVar5 <= (ulong)((long)pbVar27 - (long)local_d8)) {
                if (local_108[3] < pbVar21 + (long)pZVar20) {
                  local_d0 = (ZSTD_seqSymbol *)(local_108[3] + -(long)pbVar21);
                  memmove(pbVar27,pbVar21,(size_t)local_d0);
                  pbVar27 = pbVar27 + (long)local_d0;
                  pZVar20 = (ZSTD_seqSymbol *)((long)local_1a0 - (long)local_d0);
                  if ((pbVar27 <= local_1b0) &&
                     (pbVar21 = local_1b8, (ZSTD_seqSymbol *)0x2 < pZVar20)) goto LAB_0014f596;
                  pZVar23 = local_1a8;
                  if (pZVar20 != (ZSTD_seqSymbol *)0x0) {
                    uVar26 = 0;
                    do {
                      pbVar27[uVar26] = local_1b8[uVar26];
                      uVar26 = uVar26 + 1;
                    } while ((ZSTD_seqSymbol *)(uVar26 & 0xffffffff) < pZVar20);
                  }
                }
                else {
                  memmove(pbVar27,pbVar21,(size_t)pZVar20);
                  pZVar23 = local_1a8;
                }
              }
            }
            else {
LAB_0014f596:
              local_1a0 = pZVar20;
              if (uVar5 < 8) {
                iVar8 = *(int *)(ZSTD_execSequence_dec64table + uVar5 * 4);
                *pbVar27 = *pbVar21;
                pbVar27[1] = pbVar21[1];
                pbVar27[2] = pbVar21[2];
                pbVar27[3] = pbVar21[3];
                pbVar17 = pbVar21 + *(uint *)(ZSTD_execSequence_dec32table + uVar5 * 4);
                pbVar21 = pbVar21 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar5 * 4) -
                                    (long)iVar8);
                *(undefined4 *)(pbVar27 + 4) = *(undefined4 *)pbVar17;
              }
              else {
                *(undefined8 *)pbVar27 = *(undefined8 *)pbVar21;
              }
              pbVar17 = pbVar27 + 8;
              pbVar21 = pbVar21 + 8;
              pZVar23 = local_1a8;
              if (local_e0 < pbVar25) {
                pbVar27 = pbVar17;
                pbVar18 = pbVar21;
                if (pbVar17 < local_1b0) {
                  do {
                    *(undefined8 *)pbVar27 = *(undefined8 *)pbVar18;
                    pbVar27 = pbVar27 + 8;
                    pbVar18 = pbVar18 + 8;
                  } while (pbVar27 < local_1b0);
                  pbVar21 = pbVar21 + ((long)local_1b0 - (long)pbVar17);
                  pbVar17 = local_1b0;
                }
                for (; pbVar17 < pbVar25; pbVar17 = pbVar17 + 1) {
                  bVar13 = *pbVar21;
                  pbVar21 = pbVar21 + 1;
                  *pbVar17 = bVar13;
                }
              }
              else {
                do {
                  *(undefined8 *)pbVar17 = *(undefined8 *)pbVar21;
                  pbVar17 = pbVar17 + 8;
                  pbVar21 = pbVar21 + 8;
                } while (pbVar17 < pbVar27 + (long)local_1a0);
              }
            }
          }
        }
      }
      if ((ZSTD_seqSymbol *)0xffffffffffffff88 < pZVar23) goto LAB_0014f730;
      *puVar28 = uVar22;
      *(long *)((long)&local_b0 + uVar24) = lVar14;
      *(ZSTD_seqSymbol **)((long)local_a8 + uVar24) = local_180;
      *(long *)((long)local_a8 + uVar24 + 8) = (long)local_198 - (long)local_180;
      dst = (void *)((long)dst + (long)pZVar23);
      uVar26 = (ulong)(uVar7 + 1);
    } while( true );
  }
  bVar6 = false;
  goto LAB_0014fa8f;
LAB_0014f730:
  bVar6 = false;
  pvVar30 = local_188;
  local_1d0 = pZVar23;
  goto LAB_0014fa8f;
  while (uVar7 = uVar7 + 1, (int)uVar7 < local_1c0) {
LAB_0014f761:
    uVar22 = (ulong)((uVar7 & 3) << 5);
    uVar26 = *(ulong *)((long)&local_b8 + uVar22);
    sVar19 = *(size_t *)((long)&local_b0 + uVar22);
    pZVar12 = (ZSTD_seqSymbol *)(uVar26 + sVar19);
    pbVar25 = (byte *)((long)dst + (long)pZVar12);
    local_1d0 = (ZSTD_seqSymbol *)0xffffffffffffffba;
    if (pbVar25 <= oend_00) {
      pBVar16 = local_1c8 + uVar26;
      local_1d0 = (ZSTD_seqSymbol *)0xffffffffffffffec;
      if (pBVar16 <= local_e8) {
        pbVar27 = (byte *)((long)dst + uVar26);
        if (local_1b0 < pbVar27) {
          sequence_00.matchLength = *(undefined8 *)((long)&local_b0 + uVar22);
          sequence_00.litLength = *(undefined8 *)((long)&local_b8 + uVar22);
          sequence_00.offset = *(undefined8 *)((long)local_a8 + uVar22);
          sequence_00.match = *(BYTE **)((long)local_a8 + uVar22 + 8);
          local_1d0 = (ZSTD_seqSymbol *)
                      ZSTD_execSequenceLast7
                                ((BYTE *)dst,oend_00,sequence_00,&local_1c8,local_e8,local_1b8,
                                 local_d8,local_108[3]);
        }
        else {
          uVar24 = *(ulong *)((long)local_a8 + uVar22);
          pbVar21 = *(byte **)((long)local_a8 + uVar22 + 8);
          *(undefined8 *)dst = *(undefined8 *)local_1c8;
          if (8 < uVar26) {
            pbVar17 = (byte *)((long)dst + 8);
            do {
              local_1c8 = local_1c8 + 8;
              *(undefined8 *)pbVar17 = *(undefined8 *)local_1c8;
              pbVar17 = pbVar17 + 8;
            } while (pbVar17 < pbVar27);
          }
          local_1c8 = pBVar16;
          if ((ulong)((long)pbVar27 - (long)local_1b8) < uVar24) {
            if (uVar24 <= (ulong)((long)pbVar27 - (long)local_d8)) {
              if (local_108[3] < pbVar21 + sVar19) {
                __n = (long)local_108[3] - (long)pbVar21;
                memmove(pbVar27,pbVar21,__n);
                pbVar27 = pbVar27 + __n;
                sVar19 = sVar19 - __n;
                if ((pbVar27 <= local_1b0) && (pbVar21 = local_1b8, 2 < sVar19)) goto LAB_0014f903;
                local_1d0 = pZVar12;
                if (sVar19 != 0) {
                  uVar26 = 0;
                  do {
                    pbVar27[uVar26] = local_1b8[uVar26];
                    uVar26 = uVar26 + 1;
                  } while ((uVar26 & 0xffffffff) < sVar19);
                }
              }
              else {
                memmove(pbVar27,pbVar21,sVar19);
                local_1d0 = pZVar12;
              }
            }
          }
          else {
LAB_0014f903:
            if (uVar24 < 8) {
              iVar8 = *(int *)(ZSTD_execSequence_dec64table + uVar24 * 4);
              *pbVar27 = *pbVar21;
              pbVar27[1] = pbVar21[1];
              pbVar27[2] = pbVar21[2];
              pbVar27[3] = pbVar21[3];
              pbVar17 = pbVar21 + *(uint *)(ZSTD_execSequence_dec32table + uVar24 * 4);
              pbVar21 = pbVar21 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar24 * 4) -
                                  (long)iVar8);
              *(undefined4 *)(pbVar27 + 4) = *(undefined4 *)pbVar17;
            }
            else {
              *(undefined8 *)pbVar27 = *(undefined8 *)pbVar21;
            }
            pbVar17 = pbVar27 + 8;
            pbVar21 = pbVar21 + 8;
            if (local_e0 < pbVar25) {
              pbVar27 = pbVar17;
              pbVar18 = pbVar21;
              if (pbVar17 < local_1b0) {
                do {
                  *(undefined8 *)pbVar27 = *(undefined8 *)pbVar18;
                  pbVar27 = pbVar27 + 8;
                  pbVar18 = pbVar18 + 8;
                } while (pbVar27 < local_1b0);
                pbVar21 = pbVar21 + ((long)local_1b0 - (long)pbVar17);
                pbVar17 = local_1b0;
              }
              for (; local_1d0 = pZVar12, pbVar17 < pbVar25; pbVar17 = pbVar17 + 1) {
                bVar13 = *pbVar21;
                pbVar21 = pbVar21 + 1;
                *pbVar17 = bVar13;
              }
            }
            else {
              do {
                *(undefined8 *)pbVar17 = *(undefined8 *)pbVar21;
                pbVar17 = pbVar17 + 8;
                pbVar21 = pbVar21 + 8;
                local_1d0 = pZVar12;
              } while (pbVar17 < pbVar27 + sVar19);
            }
          }
        }
      }
    }
    bVar6 = false;
    pZVar12 = (ZSTD_seqSymbol *)0x0;
    if (local_1d0 < (ZSTD_seqSymbol *)0xffffffffffffff89) {
      pZVar12 = local_1d0;
    }
    dst = (void *)((long)dst + (long)pZVar12);
    pvVar30 = local_188;
    local_1f8 = (BYTE *)dst;
    if ((ZSTD_seqSymbol *)0xffffffffffffff88 < local_1d0) goto LAB_0014fa8f;
  }
LAB_0014fa55:
  lVar14 = 0;
  do {
    (dctx->entropy).rep[lVar14] = *(U32 *)(local_120 + lVar14);
    lVar14 = lVar14 + 1;
    bVar6 = true;
    pvVar30 = local_188;
    local_1f8 = (BYTE *)dst;
    local_1d0 = pZVar1;
  } while (lVar14 != 3);
LAB_0014fa8f:
  pBVar16 = local_e8;
  dst = pvVar30;
  if (bVar6) {
LAB_0014faa5:
    sVar19 = (long)pBVar16 - (long)local_1c8;
    if ((ulong)((long)oend_00 - (long)local_1f8) < sVar19) {
      local_1d0 = (ZSTD_seqSymbol *)0xffffffffffffffba;
    }
    else {
      memcpy(local_1f8,local_1c8,sVar19);
      local_1d0 = (ZSTD_seqSymbol *)(local_1f8 + (sVar19 - (long)dst));
    }
  }
  return (size_t)local_1d0;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}